

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmGhsMultiTargetGenerator::WriteSources(cmGhsMultiTargetGenerator *this,ostream *fout_proj)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  iterator __position;
  pointer ppcVar3;
  pointer ppcVar4;
  cmGeneratorTarget *pcVar5;
  cmSourceFile *this_00;
  iterator iVar6;
  undefined8 uVar7;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  string *psVar14;
  cmSourceGroup *this_01;
  vector<cmSourceFile*,std::allocator<cmSourceFile*>> *this_02;
  iterator iVar15;
  _Base_ptr p_Var16;
  mapped_type *pmVar17;
  char *pcVar18;
  cmGeneratedFileStream *pcVar19;
  ostream *poVar20;
  cmCustomCommand *pcVar21;
  long *plVar22;
  cmSourceFileLocation *pcVar23;
  ulong *puVar24;
  uint __val;
  cmSourceFile **__args;
  pointer __k;
  _Base_ptr p_Var25;
  _Base_ptr p_Var26;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  __i;
  ulong uVar27;
  pointer ppcVar28;
  cmGhsMultiTargetGenerator *pcVar29;
  uint __len;
  long lVar30;
  ulong *puVar31;
  bool bVar32;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar33;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string fpath;
  cmGeneratedFileStream *f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groupFilesList;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_> gfiles;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groupNames;
  string lpath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  standardGroups;
  string gn;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  groupFiles;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> sourceGroups;
  cmGeneratedFileStream *local_4f0;
  string local_4e8;
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4a0;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_488;
  _Base_ptr local_468;
  iterator iStack_460;
  _Base_ptr local_458;
  _Base_ptr local_450;
  undefined1 local_448 [32];
  string local_428;
  string local_408;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3e8;
  _Base_ptr local_3b8;
  _Base_ptr local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3a8;
  string local_3a0;
  undefined1 local_380 [168];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  undefined1 local_2c0 [32];
  undefined1 *local_2a0 [2];
  undefined1 local_290 [16];
  _Base_ptr local_280 [2];
  undefined1 local_270 [16];
  _Base_ptr local_260;
  undefined1 local_250 [16];
  _Alloc_hider local_240;
  char local_230 [16];
  long *local_220 [2];
  long local_210 [51];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  local_78;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> local_48;
  
  local_448._0_8_ = (cmSourceFile **)0x0;
  local_448._8_8_ = (cmSourceFile **)0x0;
  local_448._16_8_ = (pointer)0x0;
  local_4b8._16_8_ = fout_proj;
  cmGeneratorTarget::GetSourceFiles
            (this->GeneratorTarget,
             (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_448,&this->ConfigName)
  ;
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector
            (&local_48,&this->Makefile->SourceGroups);
  uVar7 = local_448._8_8_;
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3e8._M_impl.super__Rb_tree_header._M_header;
  local_3e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3e8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_448._0_8_ != local_448._8_8_) {
    __args = (cmSourceFile **)local_448._0_8_;
    do {
      pcVar1 = this->Makefile;
      psVar14 = cmSourceFile::GetFullPath(*__args,(string *)0x0);
      this_01 = cmMakefile::FindSourceGroup(pcVar1,psVar14,&local_48);
      psVar14 = cmSourceGroup::GetFullName_abi_cxx11_(this_01);
      pcVar2 = (psVar14->_M_dataplus)._M_p;
      local_2c0._0_8_ = local_2c0 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2c0,pcVar2,pcVar2 + psVar14->_M_string_length);
      this_02 = (vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                              *)&local_78,(key_type *)local_2c0);
      __position._M_current = *(cmSourceFile ***)(this_02 + 8);
      if (__position._M_current == *(cmSourceFile ***)(this_02 + 0x10)) {
        std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
        _M_realloc_insert<cmSourceFile*const&>(this_02,__position,__args);
      }
      else {
        *__position._M_current = *__args;
        *(long *)(this_02 + 8) = *(long *)(this_02 + 8) + 8;
      }
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_3e8,(key_type *)local_2c0);
      if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
        operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
      }
      __args = __args + 1;
    } while (__args != (cmSourceFile **)uVar7);
  }
  local_2c0._0_8_ = local_2c0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"CMake Rules","");
  local_2a0[0] = local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"Header Files","");
  local_280[0] = (_Base_ptr)local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"Source Files","");
  local_260 = (_Base_ptr)local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"Object Files","");
  local_240._M_p = local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"Object Libraries","");
  plVar22 = local_210;
  local_220[0] = plVar22;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"Resources","");
  __l._M_len = 6;
  __l._M_array = (iterator)local_2c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2d8,__l,(allocator_type *)local_380);
  lVar30 = -0xc0;
  do {
    if (plVar22 != (long *)plVar22[-2]) {
      operator_delete((long *)plVar22[-2],*plVar22 + 1);
    }
    plVar22 = plVar22 + -4;
    lVar30 = lVar30 + 0x20;
  } while (lVar30 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_4a0,local_78._M_impl.super__Rb_tree_header._M_node_count,
           (allocator_type *)local_2c0);
  uVar27 = 0;
  if (local_2d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __k = local_2d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar15 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&local_3e8,__k);
      iVar12 = (int)uVar27;
      if ((_Rb_tree_header *)iVar15._M_node == &local_3e8._M_impl.super__Rb_tree_header) {
        if ((this->TagType == CUSTOM_TARGET) &&
           (iVar11 = std::__cxx11::string::compare((char *)__k), iVar11 == 0)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize(&local_4a0,
                   ((long)local_4a0.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_4a0.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
          std::__cxx11::string::_M_assign
                    ((string *)
                     (local_4a0.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + iVar12));
          goto LAB_0025e32b;
        }
      }
      else {
        std::__cxx11::string::_M_assign
                  ((string *)
                   (local_4a0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + iVar12));
        pVar33 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::equal_range(&local_3e8,__k);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_aux(&local_3e8,(_Base_ptr)pVar33.first._M_node,(_Base_ptr)pVar33.second._M_node);
LAB_0025e32b:
        uVar27 = (ulong)(iVar12 + 1);
      }
      __k = __k + 1;
    } while (__k != local_2d8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
    uVar27 = (ulong)(int)uVar27;
  }
  local_2c0._8_8_ = (cmGeneratorTarget *)0x0;
  local_2c0._16_8_ = local_2c0._16_8_ & 0xffffffffffffff00;
  local_2c0._0_8_ = local_2c0 + 0x10;
  iVar15 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&local_3e8,(key_type *)local_2c0);
  if ((_Rb_tree_header *)iVar15._M_node != &local_3e8._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::_M_assign
              ((string *)
               (local_4a0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1));
    pVar33 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::equal_range(&local_3e8,(key_type *)local_2c0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_aux(&local_3e8,(_Base_ptr)pVar33.first._M_node,(_Base_ptr)pVar33.second._M_node);
  }
  if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
    operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
  }
  p_Var25 = (_Base_ptr)
            local_4a0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  p_Var26 = (_Base_ptr)
            local_4a0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((_Rb_tree_header *)local_3e8._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_3e8._M_impl.super__Rb_tree_header) {
    lVar30 = uVar27 << 5;
    p_Var16 = local_3e8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      std::__cxx11::string::_M_assign
                ((string *)
                 ((long)&((local_4a0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar30));
      p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
      lVar30 = lVar30 + 0x20;
      p_Var25 = (_Base_ptr)
                local_4a0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      p_Var26 = (_Base_ptr)
                local_4a0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while ((_Rb_tree_header *)p_Var16 != &local_3e8._M_impl.super__Rb_tree_header);
  }
  for (; p_Var25 != p_Var26; p_Var25 = p_Var25 + 1) {
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                            *)&local_78,(key_type *)p_Var25);
    ppcVar3 = (pmVar17->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl
              .super__Vector_impl_data._M_start;
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                            *)&local_78,(key_type *)p_Var25);
    ppcVar4 = (pmVar17->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl
              .super__Vector_impl_data._M_finish;
    if (ppcVar3 != ppcVar4) {
      uVar27 = (long)ppcVar4 - (long)ppcVar3 >> 3;
      lVar30 = 0x3f;
      if (uVar27 != 0) {
        for (; uVar27 >> lVar30 == 0; lVar30 = lVar30 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                (ppcVar3,ppcVar4,((uint)lVar30 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)ppcVar4 - (long)ppcVar3 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                  (ppcVar3,ppcVar4);
      }
      else {
        ppcVar28 = ppcVar3 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                  (ppcVar3,ppcVar28);
        for (; ppcVar28 != ppcVar4; ppcVar28 = ppcVar28 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,__gnu_cxx::__ops::_Val_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                    (ppcVar28);
        }
      }
    }
  }
  local_468 = (_Base_ptr)0x0;
  iStack_460._M_current = (cmGeneratedFileStream **)0x0;
  local_458 = (_Base_ptr)0x0;
  local_3b8 = (_Base_ptr)
              local_4a0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  p_Var26 = local_468;
  iVar6._M_current = iStack_460._M_current;
  if (local_4a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_4a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_3a8 = &this->Name;
    p_Var25 = (_Base_ptr)
              local_4a0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      puVar31 = (ulong *)(local_2c0 + 0x10);
      pcVar5 = this->GeneratorTarget;
      local_2c0._0_8_ = puVar31;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2c0,"GHS_NO_SOURCE_GROUP_FILE","");
      pcVar18 = cmGeneratorTarget::GetProperty(pcVar5,(string *)local_2c0);
      bVar9 = cmSystemTools::IsOn(pcVar18);
      bVar10 = true;
      if (!bVar9) {
        pcVar1 = this->Makefile;
        local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_408,"CMAKE_GHS_NO_SOURCE_GROUP_FILE","");
        pcVar18 = cmMakefile::GetDefinition(pcVar1,&local_408);
        bVar10 = cmSystemTools::IsOn(pcVar18);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
        }
      }
      if ((ulong *)local_2c0._0_8_ != puVar31) {
        operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
      }
      local_4f0 = (cmGeneratedFileStream *)local_4b8._16_8_;
      if ((bVar10 == false) && (p_Var25->_M_parent != (_Base_ptr)0x0)) {
        local_2c0._0_8_ = puVar31;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2c0,*(long *)p_Var25,
                   (long)&p_Var25->_M_parent->_M_color + *(long *)p_Var25);
        cmsys::SystemTools::ReplaceString((string *)local_2c0,"\\","_");
        (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xc])
                  (local_380,this->LocalGenerator,this->GeneratorTarget);
        std::__cxx11::string::append(local_380);
        std::__cxx11::string::_M_append(local_380,local_2c0._0_8_);
        std::__cxx11::string::append(local_380);
        psVar14 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                            (&this->LocalGenerator->super_cmLocalGenerator);
        local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
        pcVar2 = (psVar14->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4e8,pcVar2,pcVar2 + psVar14->_M_string_length);
        std::__cxx11::string::append((char *)&local_4e8);
        std::__cxx11::string::_M_append((char *)&local_4e8,local_380._0_8_);
        pcVar19 = (cmGeneratedFileStream *)operator_new(0x248);
        cmGeneratedFileStream::cmGeneratedFileStream(pcVar19,&local_4e8,false,None);
        local_4c8._0_8_ = pcVar19;
        cmGeneratedFileStream::SetCopyIfDifferent(pcVar19,true);
        if ((_Base_ptr)iStack_460._M_current == local_458) {
          std::vector<cmGeneratedFileStream*,std::allocator<cmGeneratedFileStream*>>::
          _M_realloc_insert<cmGeneratedFileStream*const&>
                    ((vector<cmGeneratedFileStream*,std::allocator<cmGeneratedFileStream*>> *)
                     &local_468,iStack_460,(cmGeneratedFileStream **)local_4c8);
        }
        else {
          *iStack_460._M_current = (cmGeneratedFileStream *)local_4c8._0_8_;
          iStack_460._M_current = iStack_460._M_current + 1;
        }
        local_4f0 = (cmGeneratedFileStream *)local_4c8._0_8_;
        cmGlobalGhsMultiGenerator::WriteFileHeader
                  ((cmGlobalGhsMultiGenerator *)
                   (this->LocalGenerator->super_cmLocalGenerator).GlobalGenerator,
                   (ostream *)local_4c8._0_8_);
        GhsMultiGpj::WriteGpjTag(SUBPROJECT,(ostream *)local_4c8._0_8_);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4b8._16_8_,(char *)local_380._0_8_,local_380._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
        GhsMultiGpj::WriteGpjTag(SUBPROJECT,(ostream *)local_4b8._16_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
          operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_380._0_8_ != local_380 + 0x10) {
          operator_delete((void *)local_380._0_8_,CONCAT71(local_380._17_7_,local_380[0x10]) + 1);
        }
        if ((ulong *)local_2c0._0_8_ != puVar31) {
          operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
        }
      }
      if (bVar10 == false) {
        if (p_Var25->_M_parent == (_Base_ptr)0x0) goto LAB_0025e8ac;
      }
      else {
        if (p_Var25->_M_parent == (_Base_ptr)0x0) {
LAB_0025e8ac:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4f0,"{comment} Others",0x10);
          std::ios::widen((char)(local_4f0->super_ofstream).
                                super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream[-3] + (char)local_4f0);
          pcVar19 = local_4f0;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f0,"{comment} ",10);
          pcVar19 = (cmGeneratedFileStream *)
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4f0,*(char **)p_Var25,(long)p_Var25->_M_parent);
          std::ios::widen((char)(pcVar19->super_ofstream).
                                super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream[-3] + (char)pcVar19);
        }
        std::ostream::put((char)pcVar19);
        std::ostream::flush();
      }
      iVar12 = std::__cxx11::string::compare((char *)p_Var25);
      local_3b0 = p_Var25;
      if (iVar12 == 0) {
        local_488.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_488.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_488.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar10 = ComputeCustomCommandOrder(this,&local_488);
        if (bVar10) {
          psVar14 = cmGeneratorTarget::GetName_abi_cxx11_(this->GeneratorTarget);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_380,"The custom commands for target [",psVar14);
          plVar22 = (long *)std::__cxx11::string::append((char *)local_380);
          puVar24 = (ulong *)(plVar22 + 2);
          if ((ulong *)*plVar22 == puVar24) {
            local_2c0._16_8_ = *puVar24;
            local_2c0._24_8_ = plVar22[3];
            local_2c0._0_8_ = puVar31;
          }
          else {
            local_2c0._16_8_ = *puVar24;
            local_2c0._0_8_ = (ulong *)*plVar22;
          }
          local_2c0._8_8_ = plVar22[1];
          *plVar22 = (long)puVar24;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          if ((undefined1 *)local_380._0_8_ != local_380 + 0x10) {
            operator_delete((void *)local_380._0_8_,CONCAT71(local_380._17_7_,local_380[0x10]) + 1);
          }
          cmSystemTools::Error((string *)local_2c0);
          if ((ulong *)local_2c0._0_8_ != puVar31) {
            operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
          }
        }
        else {
          p_Var26 = (_Base_ptr)
                    local_488.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (local_488.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              local_488.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            do {
              pcVar23 = cmSourceFile::GetLocation(*(cmSourceFile **)p_Var26);
              pcVar2 = (this->Name)._M_dataplus._M_p;
              local_2c0._0_8_ = puVar31;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_2c0,pcVar2,pcVar2 + (this->Name)._M_string_length);
              std::__cxx11::string::append((char *)local_2c0);
              pcVar5 = (cmGeneratorTarget *)(pcVar23->Name)._M_string_length;
              if (pcVar5 == (cmGeneratorTarget *)local_2c0._8_8_) {
                if (pcVar5 == (cmGeneratorTarget *)0x0) {
                  bVar10 = true;
                }
                else {
                  iVar12 = bcmp((pcVar23->Name)._M_dataplus._M_p,(void *)local_2c0._0_8_,
                                (size_t)pcVar5);
                  bVar10 = iVar12 == 0;
                }
              }
              else {
                bVar10 = false;
              }
              if ((ulong *)local_2c0._0_8_ != puVar31) {
                operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
              }
              if (bVar10) {
                std::_V2::
                __rotate<__gnu_cxx::__normal_iterator<cmSourceFile_const**,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>>
                          (p_Var26,&p_Var26->_M_parent,
                           local_488.
                           super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
                break;
              }
              p_Var26 = (_Base_ptr)&p_Var26->_M_parent;
            } while (p_Var26 !=
                     (_Base_ptr)
                     local_488.
                     super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
          local_450 = (_Base_ptr)
                      local_488.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          if (local_488.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              local_488.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            __val = 0;
            p_Var26 = (_Base_ptr)
                      local_488.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              pcVar21 = cmSourceFile::GetCustomCommand(*(cmSourceFile **)p_Var26);
              local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
              pcVar2 = (this->ConfigName)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_428,pcVar2,pcVar2 + (this->ConfigName)._M_string_length);
              cmCustomCommandGenerator::cmCustomCommandGenerator
                        ((cmCustomCommandGenerator *)local_380,pcVar21,&local_428,
                         &this->LocalGenerator->super_cmLocalGenerator);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_428._M_dataplus._M_p != &local_428.field_2) {
                operator_delete(local_428._M_dataplus._M_p,
                                local_428.field_2._M_allocated_capacity + 1);
              }
              psVar14 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                                  (&this->LocalGenerator->super_cmLocalGenerator);
              local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
              pcVar2 = (psVar14->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_4e8,pcVar2,pcVar2 + psVar14->_M_string_length);
              (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xc])
                        (local_4c8,this->LocalGenerator,this->GeneratorTarget);
              plVar22 = (long *)std::__cxx11::string::replace
                                          ((ulong)local_4c8,0,(char *)0x0,0x57c9ed);
              puVar24 = (ulong *)(plVar22 + 2);
              if ((ulong *)*plVar22 == puVar24) {
                local_2c0._16_8_ = *puVar24;
                local_2c0._24_8_ = plVar22[3];
                local_2c0._0_8_ = puVar31;
              }
              else {
                local_2c0._16_8_ = *puVar24;
                local_2c0._0_8_ = (ulong *)*plVar22;
              }
              local_2c0._8_8_ = plVar22[1];
              *plVar22 = (long)puVar24;
              plVar22[1] = 0;
              *(undefined1 *)(plVar22 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&local_4e8,local_2c0._0_8_);
              if ((ulong *)local_2c0._0_8_ != puVar31) {
                operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
              }
              if ((cmGeneratedFileStream *)local_4c8._0_8_ != (cmGeneratedFileStream *)local_4b8) {
                operator_delete((void *)local_4c8._0_8_,(ulong)(local_4b8._0_8_ + 1));
              }
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_4c8,"/",local_3a8);
              plVar22 = (long *)std::__cxx11::string::append((char *)local_4c8);
              puVar24 = (ulong *)(plVar22 + 2);
              if ((ulong *)*plVar22 == puVar24) {
                local_2c0._16_8_ = *puVar24;
                local_2c0._24_8_ = plVar22[3];
                local_2c0._0_8_ = puVar31;
              }
              else {
                local_2c0._16_8_ = *puVar24;
                local_2c0._0_8_ = (ulong *)*plVar22;
              }
              local_2c0._8_8_ = plVar22[1];
              *plVar22 = (long)puVar24;
              plVar22[1] = 0;
              *(undefined1 *)(plVar22 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&local_4e8,local_2c0._0_8_);
              if ((ulong *)local_2c0._0_8_ != puVar31) {
                operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
              }
              if ((cmGeneratedFileStream *)local_4c8._0_8_ != (cmGeneratedFileStream *)local_4b8) {
                operator_delete((void *)local_4c8._0_8_,(ulong)(local_4b8._0_8_ + 1));
              }
              __len = 1;
              if (9 < __val) {
                uVar27 = (ulong)__val;
                uVar8 = 4;
                do {
                  __len = uVar8;
                  uVar13 = (uint)uVar27;
                  if (uVar13 < 100) {
                    __len = __len - 2;
                    goto LAB_0025f25a;
                  }
                  if (uVar13 < 1000) {
                    __len = __len - 1;
                    goto LAB_0025f25a;
                  }
                  if (uVar13 < 10000) goto LAB_0025f25a;
                  uVar27 = uVar27 / 10000;
                  uVar8 = __len + 4;
                } while (99999 < uVar13);
                __len = __len + 1;
              }
LAB_0025f25a:
              local_4c8._0_8_ = local_4b8;
              std::__cxx11::string::_M_construct((ulong)local_4c8,(char)__len);
              std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_4c8._0_8_,__len,__val);
              plVar22 = (long *)std::__cxx11::string::append(local_4c8);
              puVar24 = (ulong *)(plVar22 + 2);
              if ((ulong *)*plVar22 == puVar24) {
                local_2c0._16_8_ = *puVar24;
                local_2c0._24_8_ = plVar22[3];
                local_2c0._0_8_ = puVar31;
              }
              else {
                local_2c0._16_8_ = *puVar24;
                local_2c0._0_8_ = (ulong *)*plVar22;
              }
              local_2c0._8_8_ = plVar22[1];
              *plVar22 = (long)puVar24;
              plVar22[1] = 0;
              *(undefined1 *)(plVar22 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&local_4e8,local_2c0._0_8_);
              if ((ulong *)local_2c0._0_8_ != puVar31) {
                operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
              }
              if ((cmGeneratedFileStream *)local_4c8._0_8_ != (cmGeneratedFileStream *)local_4b8) {
                operator_delete((void *)local_4c8._0_8_,(ulong)(local_4b8._0_8_ + 1));
              }
              pcVar23 = cmSourceFile::GetLocation(*(cmSourceFile **)p_Var26);
              std::__cxx11::string::_M_append
                        ((char *)&local_4e8,(ulong)(pcVar23->Name)._M_dataplus._M_p);
              std::__cxx11::string::append((char *)&local_4e8);
              cmGeneratedFileStream::cmGeneratedFileStream
                        ((cmGeneratedFileStream *)local_2c0,&local_4e8,false,None);
              cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_2c0,true);
              WriteCustomCommandsHelper
                        (this,(ostream *)local_2c0,(cmCustomCommandGenerator *)local_380);
              pcVar29 = (cmGhsMultiTargetGenerator *)local_2c0;
              cmGeneratedFileStream::Close((cmGeneratedFileStream *)local_2c0);
              WriteCustomCommandLine
                        (pcVar29,(ostream *)local_4f0,&local_4e8,
                         (cmCustomCommandGenerator *)local_380);
              cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2c0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
                operator_delete(local_4e8._M_dataplus._M_p,
                                local_4e8.field_2._M_allocated_capacity + 1);
              }
              __val = __val + 1;
              cmCustomCommandGenerator::~cmCustomCommandGenerator
                        ((cmCustomCommandGenerator *)local_380);
              p_Var26 = (_Base_ptr)&p_Var26->_M_parent;
            } while (p_Var26 != local_450);
          }
        }
        if (this->TagType == CUSTOM_TARGET) {
          WriteBuildEvents(this,(ostream *)local_4f0);
        }
        if ((_Base_ptr)
            local_488.
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
          operator_delete(local_488.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_488.
                                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_488.
                                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        pmVar17 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                                *)&local_78,(key_type *)p_Var25);
        p_Var26 = (_Base_ptr)
                  (pmVar17->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        local_450 = (_Base_ptr)
                    (pmVar17->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        if (p_Var26 != local_450) {
          do {
            this_00 = *(cmSourceFile **)p_Var26;
            psVar14 = cmSourceFile::GetFullPath_abi_cxx11_(this_00);
            pcVar2 = (psVar14->_M_dataplus)._M_p;
            local_2c0._0_8_ = local_2c0 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_2c0,pcVar2,pcVar2 + psVar14->_M_string_length);
            cmSystemTools::ConvertToOutputSlashes((string *)local_2c0);
            local_380._0_8_ = local_380 + 0x10;
            local_380._8_8_ = (char *)0x0;
            local_380[0x10] = '\0';
            bVar10 = this->TagType == CUSTOM_TARGET;
            if (bVar10) {
              cmSourceFile::GetLanguage_abi_cxx11_(&local_3a0,this_00);
              bVar32 = true;
              bVar9 = true;
              if (local_3a0._M_string_length == 0) goto LAB_0025e9c9;
            }
            else {
LAB_0025e9c9:
              pcVar21 = cmSourceFile::GetCustomCommand(this_00);
              bVar32 = pcVar21 != (cmCustomCommand *)0x0;
              bVar9 = bVar10;
            }
            if ((bVar9) &&
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a0._M_dataplus._M_p != &local_3a0.field_2)) {
              operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1
                             );
            }
            if (bVar32) {
              std::__cxx11::string::_M_replace((ulong)local_380,0,(char *)local_380._8_8_,0x532bfb);
            }
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4f0,(char *)local_380._0_8_,local_380._8_8_);
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar20,(char *)local_2c0._0_8_,local_2c0._8_8_);
            std::ios::widen((char)poVar20->_vptr_basic_ostream[-3] + (char)poVar20);
            std::ostream::put((char)poVar20);
            std::ostream::flush();
            if (!bVar32) {
              psVar14 = cmSourceFile::GetExtension_abi_cxx11_(this_00);
              iVar12 = std::__cxx11::string::compare((char *)psVar14);
              if (iVar12 != 0) {
                psVar14 = cmSourceFile::GetExtension_abi_cxx11_(this_00);
                iVar12 = std::__cxx11::string::compare((char *)psVar14);
                if (iVar12 != 0) {
                  psVar14 = cmSourceFile::GetExtension_abi_cxx11_(this_00);
                  iVar12 = std::__cxx11::string::compare((char *)psVar14);
                  if (iVar12 != 0) {
                    WriteObjectLangOverride((ostream *)local_4f0,this_00);
                  }
                }
              }
              local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_4e8,"INCLUDE_DIRECTORIES","");
              local_4c8._0_8_ = local_4b8;
              pcVar29 = (cmGhsMultiTargetGenerator *)local_4c8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"-I","");
              WriteSourceProperty(pcVar29,(ostream *)local_4f0,this_00,&local_4e8,
                                  (string *)local_4c8);
              if ((cmGeneratedFileStream *)local_4c8._0_8_ != (cmGeneratedFileStream *)local_4b8) {
                operator_delete((void *)local_4c8._0_8_,(ulong)(local_4b8._0_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
                operator_delete(local_4e8._M_dataplus._M_p,
                                local_4e8.field_2._M_allocated_capacity + 1);
              }
              local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_4e8,"COMPILE_DEFINITIONS","");
              local_4c8._0_8_ = local_4b8;
              pcVar29 = (cmGhsMultiTargetGenerator *)local_4c8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"-D","");
              WriteSourceProperty(pcVar29,(ostream *)local_4f0,this_00,&local_4e8,
                                  (string *)local_4c8);
              if ((cmGeneratedFileStream *)local_4c8._0_8_ != (cmGeneratedFileStream *)local_4b8) {
                operator_delete((void *)local_4c8._0_8_,(ulong)(local_4b8._0_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
                operator_delete(local_4e8._M_dataplus._M_p,
                                local_4e8.field_2._M_allocated_capacity + 1);
              }
              local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_4e8,"COMPILE_OPTIONS","");
              local_4c8._0_8_ = local_4b8;
              pcVar29 = (cmGhsMultiTargetGenerator *)local_4c8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"");
              WriteSourceProperty(pcVar29,(ostream *)local_4f0,this_00,&local_4e8,
                                  (string *)local_4c8);
              if ((cmGeneratedFileStream *)local_4c8._0_8_ != (cmGeneratedFileStream *)local_4b8) {
                operator_delete((void *)local_4c8._0_8_,(ulong)(local_4b8._0_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
                operator_delete(local_4e8._M_dataplus._M_p,
                                local_4e8.field_2._M_allocated_capacity + 1);
              }
              psVar14 = cmGeneratorTarget::GetObjectName_abi_cxx11_(this->GeneratorTarget,this_00);
              local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
              pcVar2 = (psVar14->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_4e8,pcVar2,pcVar2 + psVar14->_M_string_length);
              if ((local_4e8._M_string_length != 0) &&
                 (bVar10 = cmGeneratorTarget::HasExplicitObjectName(this->GeneratorTarget,this_00),
                 bVar10)) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f0,"    -o ",7)
                ;
                poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_4f0,local_4e8._M_dataplus._M_p,
                                     local_4e8._M_string_length);
                std::ios::widen((char)poVar20->_vptr_basic_ostream[-3] + (char)poVar20);
                std::ostream::put((char)poVar20);
                std::ostream::flush();
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
                operator_delete(local_4e8._M_dataplus._M_p,
                                local_4e8.field_2._M_allocated_capacity + 1);
              }
            }
            if ((undefined1 *)local_380._0_8_ != local_380 + 0x10) {
              operator_delete((void *)local_380._0_8_,CONCAT71(local_380._17_7_,local_380[0x10]) + 1
                             );
            }
            if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
              operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
            }
            p_Var26 = (_Base_ptr)&p_Var26->_M_parent;
          } while (p_Var26 != local_450);
        }
      }
      p_Var25 = local_3b0 + 1;
      p_Var26 = local_468;
      iVar6._M_current = iStack_460._M_current;
    } while (p_Var25 != local_3b8);
  }
  for (; p_Var26 != (_Base_ptr)iVar6._M_current; p_Var26 = (_Base_ptr)&p_Var26->_M_parent) {
    cmGeneratedFileStream::Close(*(cmGeneratedFileStream **)p_Var26);
  }
  if (local_468 != (_Base_ptr)0x0) {
    operator_delete(local_468,(long)local_458 - (long)local_468);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_3e8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  ::~_Rb_tree(&local_78);
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector(&local_48);
  if ((cmSourceFile **)local_448._0_8_ != (cmSourceFile **)0x0) {
    operator_delete((void *)local_448._0_8_,local_448._16_8_ - local_448._0_8_);
  }
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteSources(std::ostream& fout_proj)
{
  /* vector of all sources for this target */
  std::vector<cmSourceFile*> sources;
  this->GeneratorTarget->GetSourceFiles(sources, this->ConfigName);

  /* vector of all groups defined for this target
   * -- but the vector is not expanded with sub groups or in any useful order
   */
  std::vector<cmSourceGroup> sourceGroups = this->Makefile->GetSourceGroups();

  /* for each source file assign it to its group */
  std::map<std::string, std::vector<cmSourceFile*>> groupFiles;
  std::set<std::string> groupNames;
  for (auto& sf : sources) {
    cmSourceGroup* sourceGroup =
      this->Makefile->FindSourceGroup(sf->GetFullPath(), sourceGroups);
    std::string gn = sourceGroup->GetFullName();
    groupFiles[gn].push_back(sf);
    groupNames.insert(std::move(gn));
  }

  /* list of known groups and the order they are displayed in a project file */
  const std::vector<std::string> standardGroups = {
    "CMake Rules",  "Header Files",     "Source Files",
    "Object Files", "Object Libraries", "Resources"
  };

  /* list of groups in the order they are displayed in a project file*/
  std::vector<std::string> groupFilesList(groupFiles.size());

  /* put the groups in the order they should be listed
   * - standard groups first, and then everything else
   *   in the order used by std::map.
   */
  int i = 0;
  for (const std::string& gn : standardGroups) {
    auto n = groupNames.find(gn);
    if (n != groupNames.end()) {
      groupFilesList[i] = *n;
      i += 1;
      groupNames.erase(gn);
    } else if (this->TagType == GhsMultiGpj::CUSTOM_TARGET &&
               gn == "CMake Rules") {
      /* make sure that rules folder always exists in case of custom targets
       * that have no custom commands except for pre or post build events.
       */
      groupFilesList.resize(groupFilesList.size() + 1);
      groupFilesList[i] = gn;
      i += 1;
    }
  }

  { /* catch-all group - is last item */
    std::string gn;
    auto n = groupNames.find(gn);
    if (n != groupNames.end()) {
      groupFilesList.back() = *n;
      groupNames.erase(gn);
    }
  }

  for (auto& n : groupNames) {
    groupFilesList[i] = n;
    i += 1;
  }

  /* sort the files within each group */
  for (auto& n : groupFilesList) {
    std::sort(groupFiles[n].begin(), groupFiles[n].end(),
              [](cmSourceFile* l, cmSourceFile* r) {
                return l->GetFullPath() < r->GetFullPath();
              });
  }

  /* list of open project files */
  std::vector<cmGeneratedFileStream*> gfiles;

  /* write files into the proper project file
   * -- groups go into main project file
   *    unless NO_SOURCE_GROUP_FILE property or variable is set.
   */
  for (auto& sg : groupFilesList) {
    std::ostream* fout;
    bool useProjectFile =
      cmSystemTools::IsOn(
        this->GeneratorTarget->GetProperty("GHS_NO_SOURCE_GROUP_FILE")) ||
      cmSystemTools::IsOn(
        this->Makefile->GetDefinition("CMAKE_GHS_NO_SOURCE_GROUP_FILE"));
    if (useProjectFile || sg.empty()) {
      fout = &fout_proj;
    } else {
      // Open the filestream in copy-if-different mode.
      std::string gname = sg;
      cmsys::SystemTools::ReplaceString(gname, "\\", "_");
      std::string lpath =
        this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
      lpath += "/";
      lpath += gname;
      lpath += cmGlobalGhsMultiGenerator::FILE_EXTENSION;
      std::string fpath = this->LocalGenerator->GetCurrentBinaryDirectory();
      fpath += "/";
      fpath += lpath;
      cmGeneratedFileStream* f = new cmGeneratedFileStream(fpath);
      f->SetCopyIfDifferent(true);
      gfiles.push_back(f);
      fout = f;
      this->GetGlobalGenerator()->WriteFileHeader(*f);
      GhsMultiGpj::WriteGpjTag(GhsMultiGpj::SUBPROJECT, *f);
      fout_proj << lpath << " ";
      GhsMultiGpj::WriteGpjTag(GhsMultiGpj::SUBPROJECT, fout_proj);
    }

    if (useProjectFile) {
      if (sg.empty()) {
        *fout << "{comment} Others" << std::endl;
      } else {
        *fout << "{comment} " << sg << std::endl;
      }
    } else if (sg.empty()) {
      *fout << "{comment} Others" << std::endl;
    }

    if (sg != "CMake Rules") {
      /* output rule for each source file */
      for (const cmSourceFile* si : groupFiles[sg]) {
        bool compile = true;
        // Convert filename to native system
        // WORKAROUND: GHS MULTI 6.1.4 and 6.1.6 are known to need backslash on
        // windows when opening some files from the search window.
        std::string fname(si->GetFullPath());
        cmSystemTools::ConvertToOutputSlashes(fname);

        /* For custom targets list any associated sources,
         * comment out source code to prevent it from being
         * compiled when processing this target.
         * Otherwise, comment out any custom command (main) dependencies that
         * are listed as source files to prevent them from being considered
         * part of the build.
         */
        std::string comment;
        if ((this->TagType == GhsMultiGpj::CUSTOM_TARGET &&
             !si->GetLanguage().empty()) ||
            si->GetCustomCommand()) {
          comment = "{comment} ";
          compile = false;
        }

        *fout << comment << fname << std::endl;
        if (compile) {
          if ("ld" != si->GetExtension() && "int" != si->GetExtension() &&
              "bsp" != si->GetExtension()) {
            WriteObjectLangOverride(*fout, si);
          }

          this->WriteSourceProperty(*fout, si, "INCLUDE_DIRECTORIES", "-I");
          this->WriteSourceProperty(*fout, si, "COMPILE_DEFINITIONS", "-D");
          this->WriteSourceProperty(*fout, si, "COMPILE_OPTIONS", "");

          /* to avoid clutter in the GUI only print out the objectName if it
           * has been renamed */
          std::string objectName = this->GeneratorTarget->GetObjectName(si);
          if (!objectName.empty() &&
              this->GeneratorTarget->HasExplicitObjectName(si)) {
            *fout << "    -o " << objectName << std::endl;
          }
        }
      }
    } else {
      std::vector<cmSourceFile const*> customCommands;
      if (ComputeCustomCommandOrder(customCommands)) {
        std::string message = "The custom commands for target [" +
          this->GeneratorTarget->GetName() + "] had a cycle.\n";
        cmSystemTools::Error(message);
      } else {
        /* Custom targets do not have a dependency on SOURCES files.
         * Therefore the dependency list may include SOURCES files after the
         * custom target. Because nothing can depend on the custom target just
         * move it to the last item.
         */
        for (auto sf = customCommands.begin(); sf != customCommands.end();
             ++sf) {
          if (((*sf)->GetLocation()).GetName() == this->Name + ".rule") {
            std::rotate(sf, sf + 1, customCommands.end());
            break;
          }
        }
        int cmdcount = 0;
        for (auto& sf : customCommands) {
          const cmCustomCommand* cc = sf->GetCustomCommand();
          cmCustomCommandGenerator ccg(*cc, this->ConfigName,
                                       this->LocalGenerator);

          // Open the filestream for this custom command
          std::string fname =
            this->LocalGenerator->GetCurrentBinaryDirectory();
          fname += "/" +
            this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
          fname += "/" + this->Name + "_cc";
          fname += std::to_string(cmdcount++) + "_";
          fname += (sf->GetLocation()).GetName();
          fname += this->CmdWindowsShell ? ".bat" : ".sh";
          cmGeneratedFileStream f(fname);
          f.SetCopyIfDifferent(true);
          this->WriteCustomCommandsHelper(f, ccg);
          f.Close();
          this->WriteCustomCommandLine(*fout, fname, ccg);
        }
      }
      if (this->TagType == GhsMultiGpj::CUSTOM_TARGET) {
        this->WriteBuildEvents(*fout);
      }
    }
  }

  for (cmGeneratedFileStream* f : gfiles) {
    f->Close();
  }
}